

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O3

void decorr_stereo_pass(decorr_pass *dpp,int32_t *buffer,int32_t sample_count)

{
  uint *puVar1;
  ushort uVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  long in_FS_OFFSET;
  int32_t temp_samples [8];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar10 = (int)dpp->delta;
  iVar6 = (int)dpp->weight_A;
  iVar5 = (int)dpp->weight_B;
  puVar1 = (uint *)(buffer + (uint)(sample_count * 2));
  uVar2 = dpp->term;
  uVar13 = (uint)uVar2;
  if (uVar2 < 0xfffd) {
    if (uVar2 == 0x11) {
      if (sample_count != 0) {
        do {
          iVar7 = dpp->samples_A[1];
          iVar3 = dpp->samples_A[0] * 2;
          uVar13 = iVar3 - iVar7;
          dpp->samples_A[1] = dpp->samples_A[0];
          if ((int)(short)(ushort)uVar13 == uVar13) {
            iVar15 = (int)(uVar13 * iVar6 + 0x200) >> 10;
          }
          else {
            iVar15 = (int)(((ulong)(long)(int)uVar13 >> 9 & 0x1ffffff80) * (long)iVar6 +
                           ((ulong)(ushort)uVar13 * (long)iVar6 >> 9) + 1 >> 1);
          }
          uVar8 = *buffer;
          dpp->samples_A[0] = iVar15 + uVar8;
          if ((iVar3 != iVar7) && (*buffer != 0)) {
            iVar6 = iVar6 + ((int)(*buffer ^ uVar13) >> 0x1e | 1U) * iVar10;
          }
          *buffer = iVar15 + uVar8;
          iVar7 = dpp->samples_B[1];
          iVar3 = dpp->samples_B[0] * 2;
          uVar13 = iVar3 - iVar7;
          dpp->samples_B[1] = dpp->samples_B[0];
          if ((int)(short)(ushort)uVar13 == uVar13) {
            iVar15 = (int)(uVar13 * iVar5 + 0x200) >> 10;
          }
          else {
            iVar15 = (int)(((ulong)(long)(int)uVar13 >> 9 & 0x1ffffff80) * (long)iVar5 +
                           ((ulong)(ushort)uVar13 * (long)iVar5 >> 9) + 1 >> 1);
          }
          uVar8 = ((uint *)buffer)[1];
          dpp->samples_B[0] = iVar15 + uVar8;
          if ((iVar3 != iVar7) && (((uint *)buffer)[1] != 0)) {
            iVar5 = iVar5 + ((int)(((uint *)buffer)[1] ^ uVar13) >> 0x1e | 1U) * iVar10;
          }
          ((uint *)buffer)[1] = iVar15 + uVar8;
          buffer = (int32_t *)((uint *)buffer + 2);
        } while (buffer < puVar1);
      }
      goto LAB_001b0f95;
    }
    if (uVar2 == 0x12) {
      if (sample_count != 0) {
        do {
          uVar8 = dpp->samples_A[0] * 3 - dpp->samples_A[1];
          uVar13 = (int)uVar8 >> 1;
          dpp->samples_A[1] = dpp->samples_A[0];
          if ((int)(short)(ushort)uVar13 == uVar13) {
            iVar7 = (int)(uVar13 * iVar6 + 0x200) >> 10;
          }
          else {
            iVar7 = (int)(((ulong)(long)(int)uVar13 >> 9 & 0x1ffffff80) * (long)iVar6 +
                          ((ulong)(ushort)uVar13 * (long)iVar6 >> 9) + 1 >> 1);
          }
          uVar12 = *buffer;
          dpp->samples_A[0] = iVar7 + uVar12;
          if ((1 < uVar8) && (*buffer != 0)) {
            iVar6 = iVar6 + ((int)(*buffer ^ uVar13) >> 0x1e | 1U) * iVar10;
          }
          *buffer = iVar7 + uVar12;
          uVar8 = dpp->samples_B[0] * 3 - dpp->samples_B[1];
          uVar13 = (int)uVar8 >> 1;
          dpp->samples_B[1] = dpp->samples_B[0];
          if ((int)(short)(ushort)uVar13 == uVar13) {
            iVar7 = (int)(uVar13 * iVar5 + 0x200) >> 10;
          }
          else {
            iVar7 = (int)(((ulong)(long)(int)uVar13 >> 9 & 0x1ffffff80) * (long)iVar5 +
                          ((ulong)(ushort)uVar13 * (long)iVar5 >> 9) + 1 >> 1);
          }
          uVar12 = ((uint *)buffer)[1];
          dpp->samples_B[0] = iVar7 + uVar12;
          if ((1 < uVar8) && (((uint *)buffer)[1] != 0)) {
            iVar5 = iVar5 + ((int)(((uint *)buffer)[1] ^ uVar13) >> 0x1e | 1U) * iVar10;
          }
          ((uint *)buffer)[1] = iVar7 + uVar12;
          buffer = (int32_t *)((uint *)buffer + 2);
        } while (buffer < puVar1);
      }
      goto LAB_001b0f95;
    }
  }
  else {
    if (uVar2 == 0xffff) {
      if (sample_count != 0) {
        do {
          uVar13 = *buffer;
          uVar8 = dpp->samples_A[0];
          if ((int)(short)uVar8 == uVar8) {
            uVar12 = ((int)(uVar8 * iVar6 + 0x200) >> 10) + uVar13;
            if (uVar8 != 0) goto LAB_001b0a96;
          }
          else {
            uVar12 = (int)(((ulong)(uVar8 & 0xffff) * (long)iVar6 >> 9) +
                           ((ulong)(long)(int)uVar8 >> 9 & 0x1ffffff80) * (long)iVar6 + 1 >> 1) +
                     uVar13;
LAB_001b0a96:
            if (uVar13 != 0) {
              if ((int)(uVar8 ^ uVar13) < 0) {
                iVar6 = iVar6 - iVar10;
                iVar7 = -0x400;
                if (iVar6 < -0x400) goto LAB_001b0ab5;
              }
              else {
                iVar6 = iVar6 + iVar10;
                iVar7 = 0x400;
                if (0x400 < iVar6) {
LAB_001b0ab5:
                  iVar6 = iVar7;
                }
              }
            }
          }
          *buffer = uVar12;
          if ((int)(short)(ushort)uVar12 == uVar12) {
            uVar13 = ((int)(uVar12 * iVar5 + 0x200) >> 10) + ((uint *)buffer)[1];
            dpp->samples_A[0] = uVar13;
            if (uVar12 != 0) goto LAB_001b0b16;
          }
          else {
            uVar13 = ((uint *)buffer)[1] +
                     (int)(((ulong)(long)(int)uVar12 >> 9 & 0x1ffffff80) * (long)iVar5 +
                           ((ulong)(ushort)uVar12 * (long)iVar5 >> 9) + 1 >> 1);
            dpp->samples_A[0] = uVar13;
LAB_001b0b16:
            if (((uint *)buffer)[1] != 0) {
              if ((int)(((uint *)buffer)[1] ^ uVar12) < 0) {
                iVar5 = iVar5 - iVar10;
                iVar7 = -0x400;
                if (iVar5 < -0x400) goto LAB_001b0b32;
              }
              else {
                iVar5 = iVar5 + iVar10;
                iVar7 = 0x400;
                if (0x400 < iVar5) {
LAB_001b0b32:
                  iVar5 = iVar7;
                }
              }
            }
          }
          ((uint *)buffer)[1] = uVar13;
          buffer = (int32_t *)((uint *)buffer + 2);
        } while (buffer < puVar1);
      }
      goto LAB_001b0f95;
    }
    if (uVar13 == 0xfffe) {
      if (sample_count != 0) {
        do {
          uVar13 = ((uint *)buffer)[1];
          uVar8 = dpp->samples_B[0];
          if ((int)(short)uVar8 == uVar8) {
            uVar12 = ((int)(uVar8 * iVar5 + 0x200) >> 10) + uVar13;
            if (uVar8 != 0) goto LAB_001b0bde;
          }
          else {
            uVar12 = (int)(((ulong)(uVar8 & 0xffff) * (long)iVar5 >> 9) +
                           ((ulong)(long)(int)uVar8 >> 9 & 0x1ffffff80) * (long)iVar5 + 1 >> 1) +
                     uVar13;
LAB_001b0bde:
            if (uVar13 != 0) {
              if ((int)(uVar8 ^ uVar13) < 0) {
                iVar5 = iVar5 - iVar10;
                iVar7 = -0x400;
                if (iVar5 < -0x400) goto LAB_001b0bfc;
              }
              else {
                iVar5 = iVar5 + iVar10;
                iVar7 = 0x400;
                if (0x400 < iVar5) {
LAB_001b0bfc:
                  iVar5 = iVar7;
                }
              }
            }
          }
          ((uint *)buffer)[1] = uVar12;
          if ((int)(short)(ushort)uVar12 == uVar12) {
            uVar13 = ((int)(uVar12 * iVar6 + 0x200) >> 10) + *buffer;
            dpp->samples_B[0] = uVar13;
            if (uVar12 != 0) goto LAB_001b0c5d;
          }
          else {
            uVar13 = *buffer + (int)(((ulong)(long)(int)uVar12 >> 9 & 0x1ffffff80) * (long)iVar6 +
                                     ((ulong)(ushort)uVar12 * (long)iVar6 >> 9) + 1 >> 1);
            dpp->samples_B[0] = uVar13;
LAB_001b0c5d:
            if (*buffer != 0) {
              if ((int)(*buffer ^ uVar12) < 0) {
                iVar6 = iVar6 - iVar10;
                iVar7 = -0x400;
                if (iVar6 < -0x400) goto LAB_001b0c79;
              }
              else {
                iVar6 = iVar6 + iVar10;
                iVar7 = 0x400;
                if (0x400 < iVar6) {
LAB_001b0c79:
                  iVar6 = iVar7;
                }
              }
            }
          }
          *buffer = uVar13;
          buffer = (int32_t *)((uint *)buffer + 2);
        } while (buffer < puVar1);
      }
      goto LAB_001b0f95;
    }
    if (uVar13 == 0xfffd) {
      if (sample_count != 0) {
        do {
          uVar13 = *buffer;
          uVar8 = dpp->samples_A[0];
          if ((int)(short)uVar8 == uVar8) {
            uVar12 = ((int)(uVar8 * iVar6 + 0x200) >> 10) + uVar13;
            if (uVar8 != 0) goto LAB_001b0822;
          }
          else {
            uVar12 = (int)(((ulong)(uVar8 & 0xffff) * (long)iVar6 >> 9) +
                           ((ulong)(long)(int)uVar8 >> 9 & 0x1ffffff80) * (long)iVar6 + 1 >> 1) +
                     uVar13;
LAB_001b0822:
            if (uVar13 != 0) {
              if ((int)(uVar8 ^ uVar13) < 0) {
                iVar6 = iVar6 - iVar10;
                iVar7 = -0x400;
                if (iVar6 < -0x400) goto LAB_001b0841;
              }
              else {
                iVar6 = iVar6 + iVar10;
                iVar7 = 0x400;
                if (0x400 < iVar6) {
LAB_001b0841:
                  iVar6 = iVar7;
                }
              }
            }
          }
          uVar13 = ((uint *)buffer)[1];
          uVar8 = dpp->samples_B[0];
          if ((int)(short)uVar8 == uVar8) {
            uVar14 = ((int)(uVar8 * iVar5 + 0x200) >> 10) + uVar13;
            if (uVar8 != 0) goto LAB_001b0899;
          }
          else {
            uVar14 = (int)(((ulong)(uVar8 & 0xffff) * (long)iVar5 >> 9) +
                           ((ulong)(long)(int)uVar8 >> 9 & 0x1ffffff80) * (long)iVar5 + 1 >> 1) +
                     uVar13;
LAB_001b0899:
            if (uVar13 != 0) {
              if ((int)(uVar8 ^ uVar13) < 0) {
                iVar5 = iVar5 - iVar10;
                iVar7 = -0x400;
                if (iVar5 < -0x400) goto LAB_001b08b1;
              }
              else {
                iVar5 = iVar5 + iVar10;
                iVar7 = 0x400;
                if (0x400 < iVar5) {
LAB_001b08b1:
                  iVar5 = iVar7;
                }
              }
            }
          }
          dpp->samples_B[0] = uVar12;
          *buffer = uVar12;
          dpp->samples_A[0] = uVar14;
          ((uint *)buffer)[1] = uVar14;
          buffer = (int32_t *)((uint *)buffer + 2);
        } while (buffer < puVar1);
      }
      goto LAB_001b0f95;
    }
  }
  if (sample_count != 0) {
    uVar4 = 0;
    do {
      uVar9 = uVar4;
      uVar13 = uVar13 & 7;
      uVar8 = dpp->samples_A[uVar9];
      if ((int)(short)uVar8 == uVar8) {
        uVar12 = ((int)(uVar8 * iVar6 + 0x200) >> 10) + *buffer;
        dpp->samples_A[uVar13] = uVar12;
        if (uVar8 != 0) goto LAB_001b0e62;
      }
      else {
        uVar12 = (int)(((ulong)(uVar8 & 0xffff) * (long)iVar6 >> 9) +
                       ((ulong)(long)(int)uVar8 >> 9 & 0x1ffffff80) * (long)iVar6 + 1 >> 1) +
                 *buffer;
        dpp->samples_A[uVar13] = uVar12;
LAB_001b0e62:
        if (*buffer != 0) {
          iVar6 = iVar6 + ((int)(*buffer ^ uVar8) >> 0x1e | 1U) * iVar10;
        }
      }
      *buffer = uVar12;
      uVar8 = dpp->samples_B[uVar9];
      if ((int)(short)uVar8 == uVar8) {
        uVar12 = ((int)(uVar8 * iVar5 + 0x200) >> 10) + ((uint *)buffer)[1];
        dpp->samples_B[uVar13] = uVar12;
        if (uVar8 != 0) goto LAB_001b0ee1;
      }
      else {
        uVar12 = (int)(((ulong)(uVar8 & 0xffff) * (long)iVar5 >> 9) +
                       ((ulong)(long)(int)uVar8 >> 9 & 0x1ffffff80) * (long)iVar5 + 1 >> 1) +
                 ((uint *)buffer)[1];
        dpp->samples_B[uVar13] = uVar12;
LAB_001b0ee1:
        if (((uint *)buffer)[1] != 0) {
          iVar5 = iVar5 + ((int)(((uint *)buffer)[1] ^ uVar8) >> 0x1e | 1U) * iVar10;
        }
      }
      ((uint *)buffer)[1] = uVar12;
      uVar8 = (int)uVar9 + 1U & 7;
      uVar13 = uVar13 + 1;
      buffer = (int32_t *)((uint *)buffer + 2);
      uVar4 = (ulong)uVar8;
    } while (buffer < puVar1);
    if (uVar8 != 0) {
      local_48 = *(undefined8 *)(dpp->samples_A + 4);
      uStack_40 = *(undefined8 *)(dpp->samples_A + 6);
      local_58 = *(undefined8 *)dpp->samples_A;
      uStack_50 = *(undefined8 *)(dpp->samples_A + 2);
      lVar11 = 0;
      do {
        dpp->samples_A[lVar11] =
             *(int32_t *)((long)&local_58 + (ulong)(((int)uVar9 + 1U & 7) + (int)lVar11 & 7) * 4);
        lVar11 = lVar11 + 1;
      } while (lVar11 != 8);
      local_48 = *(undefined8 *)(dpp->samples_B + 4);
      uStack_40 = *(undefined8 *)(dpp->samples_B + 6);
      local_58 = *(undefined8 *)dpp->samples_B;
      uStack_50 = *(undefined8 *)(dpp->samples_B + 2);
      uVar13 = ((byte)((char)uVar9 + 1) & 7) + 8;
      lVar11 = 0;
      do {
        *(undefined4 *)((long)dpp->samples_B + lVar11) =
             *(undefined4 *)((long)&local_58 + (ulong)(uVar13 & 7) * 4);
        uVar13 = uVar13 + 1;
        lVar11 = lVar11 + 4;
      } while (lVar11 != 0x20);
    }
  }
LAB_001b0f95:
  dpp->weight_A = (short)iVar6;
  dpp->weight_B = (short)iVar5;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void decorr_stereo_pass (struct decorr_pass *dpp, int32_t *buffer, int32_t sample_count)
{
    int32_t delta = dpp->delta, weight_A = dpp->weight_A, weight_B = dpp->weight_B;
    int32_t *bptr, *eptr = buffer + (sample_count * 2), sam_A, sam_B;
    int m, k;

    switch (dpp->term) {

        case 17:
            for (bptr = buffer; bptr < eptr; bptr += 2) {
                sam_A = 2 * dpp->samples_A [0] - dpp->samples_A [1];
                dpp->samples_A [1] = dpp->samples_A [0];
                dpp->samples_A [0] = apply_weight (weight_A, sam_A) + bptr [0];
                update_weight (weight_A, delta, sam_A, bptr [0]);
                bptr [0] = dpp->samples_A [0];

                sam_A = 2 * dpp->samples_B [0] - dpp->samples_B [1];
                dpp->samples_B [1] = dpp->samples_B [0];
                dpp->samples_B [0] = apply_weight (weight_B, sam_A) + bptr [1];
                update_weight (weight_B, delta, sam_A, bptr [1]);
                bptr [1] = dpp->samples_B [0];
            }

            break;

        case 18:
            for (bptr = buffer; bptr < eptr; bptr += 2) {
                sam_A = (3 * dpp->samples_A [0] - dpp->samples_A [1]) >> 1;
                dpp->samples_A [1] = dpp->samples_A [0];
                dpp->samples_A [0] = apply_weight (weight_A, sam_A) + bptr [0];
                update_weight (weight_A, delta, sam_A, bptr [0]);
                bptr [0] = dpp->samples_A [0];

                sam_A = (3 * dpp->samples_B [0] - dpp->samples_B [1]) >> 1;
                dpp->samples_B [1] = dpp->samples_B [0];
                dpp->samples_B [0] = apply_weight (weight_B, sam_A) + bptr [1];
                update_weight (weight_B, delta, sam_A, bptr [1]);
                bptr [1] = dpp->samples_B [0];
            }

            break;

        default:
            for (m = 0, k = dpp->term & (MAX_TERM - 1), bptr = buffer; bptr < eptr; bptr += 2) {
                sam_A = dpp->samples_A [m];
                dpp->samples_A [k] = apply_weight (weight_A, sam_A) + bptr [0];
                update_weight (weight_A, delta, sam_A, bptr [0]);
                bptr [0] = dpp->samples_A [k];

                sam_A = dpp->samples_B [m];
                dpp->samples_B [k] = apply_weight (weight_B, sam_A) + bptr [1];
                update_weight (weight_B, delta, sam_A, bptr [1]);
                bptr [1] = dpp->samples_B [k];

                m = (m + 1) & (MAX_TERM - 1);
                k = (k + 1) & (MAX_TERM - 1);
            }

            if (m) {
                int32_t temp_samples [MAX_TERM];

                memcpy (temp_samples, dpp->samples_A, sizeof (dpp->samples_A));

                for (k = 0; k < MAX_TERM; k++, m++)
                    dpp->samples_A [k] = temp_samples [m & (MAX_TERM - 1)];

                memcpy (temp_samples, dpp->samples_B, sizeof (dpp->samples_B));

                for (k = 0; k < MAX_TERM; k++, m++)
                    dpp->samples_B [k] = temp_samples [m & (MAX_TERM - 1)];
            }

            break;

        case -1:
            for (bptr = buffer; bptr < eptr; bptr += 2) {
                sam_A = bptr [0] + apply_weight (weight_A, dpp->samples_A [0]);
                update_weight_clip (weight_A, delta, dpp->samples_A [0], bptr [0]);
                bptr [0] = sam_A;
                dpp->samples_A [0] = bptr [1] + apply_weight (weight_B, sam_A);
                update_weight_clip (weight_B, delta, sam_A, bptr [1]);
                bptr [1] = dpp->samples_A [0];
            }

            break;

        case -2:
            for (bptr = buffer; bptr < eptr; bptr += 2) {
                sam_B = bptr [1] + apply_weight (weight_B, dpp->samples_B [0]);
                update_weight_clip (weight_B, delta, dpp->samples_B [0], bptr [1]);
                bptr [1] = sam_B;
                dpp->samples_B [0] = bptr [0] + apply_weight (weight_A, sam_B);
                update_weight_clip (weight_A, delta, sam_B, bptr [0]);
                bptr [0] = dpp->samples_B [0];
            }

            break;

        case -3:
            for (bptr = buffer; bptr < eptr; bptr += 2) {
                sam_A = bptr [0] + apply_weight (weight_A, dpp->samples_A [0]);
                update_weight_clip (weight_A, delta, dpp->samples_A [0], bptr [0]);
                sam_B = bptr [1] + apply_weight (weight_B, dpp->samples_B [0]);
                update_weight_clip (weight_B, delta, dpp->samples_B [0], bptr [1]);
                bptr [0] = dpp->samples_B [0] = sam_A;
                bptr [1] = dpp->samples_A [0] = sam_B;
            }

            break;
    }

    dpp->weight_A = weight_A;
    dpp->weight_B = weight_B;
}